

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVclient dfg_assoc_client(CManager cm,char *node_name,char *master_contact,EVmaster master,
                         EVclient_sources source_capabilities,EVclient_sinks sink_capabilities)

{
  _event_path_data *p_Var1;
  EVdfg p_Var2;
  FILE *pFVar3;
  int iVar4;
  __pid_t _Var5;
  attr_list p_Var6;
  EVclient p_Var7;
  char *pcVar8;
  leaf_element *plVar9;
  CMFormat format;
  CMFormat p_Var10;
  CMConnection conn;
  pthread_t pVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  attr_list local_88;
  EVnode_join_msg msg;
  timespec ts;
  
  p_Var1 = cm->evp;
  p_Var6 = INT_CMget_contact_list(cm);
  p_Var7 = (EVclient)INT_CMlookup_format(cm,EVdfg_ready_format_list);
  if (master != (EVmaster)0x0) {
    p_Var7 = master->client;
  }
  if (p_Var7 == (EVclient)0x0) {
    dfg_extern_map[0].extern_value = cod_EVdfg_trigger_reconfig;
    dfg_extern_map[1].extern_value = cod_EVdfg_flush_attrs;
    INT_EVadd_standard_routines(cm,dfg_extern_string,dfg_extern_map);
    p_Var7 = (EVclient)INT_CMmalloc(0x50);
    p_Var7->shutdown_conditions = (int *)0x0;
    p_Var7->master_contact_str = (char *)0x0;
    p_Var7->shutdown_value = 0;
    p_Var7->ready_condition = 0;
    p_Var7->master_connection = (CMConnection)0x0;
    p_Var7->master = (EVmaster_conflict)0x0;
    *(undefined8 *)&p_Var7->my_node_id = 0;
    p_Var7->dfg = (EVdfg)0x0;
    p_Var7->already_shutdown = 0;
    p_Var7->active_sink_count = 0;
    p_Var7->cm = cm;
    p_Var7->pending_auto_list = (auto_stone_list *)0x0;
    if (master_contact == (char *)0x0) {
      p_Var7->master = master;
      p_Var2 = master->dfg;
      p_Var7->dfg = p_Var2;
      if (p_Var2 != (EVdfg)0x0) {
        p_Var2->client = p_Var7;
      }
      master->client = p_Var7;
      local_88 = (attr_list)0x0;
    }
    else {
      local_88 = (attr_list)attr_list_from_string(master_contact);
      pcVar8 = strdup(master_contact);
      p_Var7->master_contact_str = pcVar8;
    }
    iVar4 = INT_CMCondition_get(cm,(CMConnection)0x0);
    p_Var7->ready_condition = iVar4;
    if (p_Var6 == (attr_list)0x0) {
      INT_CMlisten(cm);
      p_Var6 = INT_CMget_contact_list(cm);
    }
    pcVar8 = (char *)attr_list_to_string(p_Var6);
    free_attr_list(p_Var6);
    msg.node_name = strdup(node_name);
    msg.source_count = p_Var1->source_count;
    msg.contact_string = pcVar8;
    plVar9 = (leaf_element *)INT_CMmalloc((long)msg.source_count << 4);
    iVar4 = p_Var1->source_count;
    lVar13 = 0;
    msg.sources = plVar9;
    for (lVar14 = 0; lVar14 < iVar4; lVar14 = lVar14 + 1) {
      pcVar8 = strdup(*(char **)((long)&p_Var1->sources->name + lVar13));
      *(char **)((long)&plVar9->name + lVar13) = pcVar8;
      *(undefined8 *)((long)&plVar9->FMtype + lVar13) = 0;
      lVar13 = lVar13 + 0x10;
    }
    msg.sink_count = p_Var1->sink_handler_count;
    plVar9 = (leaf_element *)INT_CMmalloc((long)msg.sink_count << 4);
    iVar4 = p_Var1->sink_handler_count;
    lVar13 = 0;
    msg.sinks = plVar9;
    for (lVar14 = 0; lVar14 < iVar4; lVar14 = lVar14 + 1) {
      pcVar8 = strdup(*(char **)((long)&p_Var1->sink_handlers->name + lVar13 * 2));
      *(char **)((long)&plVar9->name + lVar13) = pcVar8;
      *(undefined8 *)((long)&plVar9->FMtype + lVar13) = 0;
      lVar13 = lVar13 + 0x10;
    }
    INT_EVregister_close_handler(cm,dfg_stone_close_handler,p_Var7);
    if (master == (EVmaster)0x0) {
      format = INT_CMregister_format(cm,EVdfg_node_join_format_list);
      INT_CMregister_format(cm,EVdfg_deploy_ack_format_list);
      INT_CMregister_format(cm,EVclient_shutdown_contribution_format_list);
      INT_CMregister_format(cm,EVdfg_conn_shutdown_format_list);
      INT_CMregister_format(cm,EVdfg_flush_attrs_reconfig_format_list);
      p_Var10 = INT_CMregister_format(cm,EVdfg_ready_format_list);
      INT_CMregister_handler(p_Var10,dfg_ready_handler,p_Var7);
      p_Var10 = INT_CMregister_format(cm,EVdfg_deploy_format_list);
      INT_CMregister_handler(p_Var10,dfg_deploy_handler,p_Var7);
      p_Var10 = INT_CMregister_format(cm,EVclient_shutdown_format_list);
      INT_CMregister_handler(p_Var10,dfg_shutdown_handler,p_Var7);
      conn = INT_CMget_conn(cm,local_88);
      pFVar3 = _stderr;
      if (conn == (CMConnection)0x0) {
        uVar12 = attr_list_to_string(local_88);
        fprintf(pFVar3,"failed to contact Master at %s\n",uVar12);
        fwrite("Join DFG failed\n",0x10,1,_stderr);
        return (EVclient)0x0;
      }
      INT_CMwrite(conn,format,&msg);
      p_Var7->master_connection = conn;
      lVar14 = 0;
      for (lVar13 = 0; lVar13 < p_Var1->source_count; lVar13 = lVar13 + 1) {
        free(*(void **)((long)&(msg.sources)->name + lVar14));
        lVar14 = lVar14 + 0x10;
      }
      free(msg.sources);
      lVar14 = 0;
      for (lVar13 = 0; lVar13 < p_Var1->sink_handler_count; lVar13 = lVar13 + 1) {
        free(*(void **)((long)&(msg.sinks)->name + lVar14));
        lVar14 = lVar14 + 0x10;
      }
      free(msg.sinks);
      free(msg.contact_string);
      free(msg.node_name);
    }
    else {
      queue_master_msg(master,&msg,DFGnode_join,(CMConnection)0x0,0);
    }
    iVar4 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar11 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar11);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"DFG %p node name %s\n",p_Var7,node_name);
    }
    fflush((FILE *)cm->CMTrace_file);
    if (local_88 != (attr_list)0x0) {
      free_attr_list(local_88);
    }
    INT_CMadd_shutdown_task(cm,free_client,p_Var7,2);
  }
  else {
    fwrite("Rejecting attempt to associate a DFG client with another DFG or with the same DFG multiple tiems.\n"
           ,0x62,1,_stderr);
    fwrite("Only one call to EVclient_assoc() or EVclient_assoc_local() per CManager allowed.\n",
           0x52,1,_stderr);
    p_Var7 = (EVclient)0x0;
  }
  return p_Var7;
}

Assistant:

extern EVclient
dfg_assoc_client(CManager cm, char* node_name, char *master_contact, EVmaster master,
		 EVclient_sources source_capabilities, EVclient_sinks sink_capabilities)
{
    event_path_data evp = cm->evp;
    attr_list master_attrs = NULL;
    CMConnection conn;
    CMFormat register_msg = NULL;
    EVnode_join_msg msg;
    attr_list contact_list = INT_CMget_contact_list(cm);
    char *my_contact_str;
    EVclient client;
    int i;

    register_msg = INT_CMlookup_format(cm, EVdfg_ready_format_list);
    if ((master && master->client) ||
	(!master && register_msg)) {
	fprintf(stderr, "Rejecting attempt to associate a DFG client with another DFG or with the same DFG multiple tiems.\n");
	fprintf(stderr, "Only one call to EVclient_assoc() or EVclient_assoc_local() per CManager allowed.\n");
	return NULL;
    }
    dfg_extern_map[0].extern_value = (void*)(intptr_t)cod_EVdfg_trigger_reconfig;
    dfg_extern_map[1].extern_value = (void*)(intptr_t)cod_EVdfg_flush_attrs;

    INT_EVadd_standard_routines(cm, dfg_extern_string, dfg_extern_map);

    client = malloc(sizeof(*client));
    memset(client, 0, sizeof(*client));
    client->cm = cm;
    client->pending_auto_list = NULL;
    if (master_contact) {
	master_attrs = attr_list_from_string(master_contact);
	client->master_contact_str = strdup(master_contact);
    } else {
	client->master = master;
	client->dfg = master->dfg;
	if (master->dfg)
	    master->dfg->client = client;
	master->client = client;
    }

    client->ready_condition = INT_CMCondition_get(cm, NULL);

    if (contact_list == NULL) {
	INT_CMlisten(cm);
	contact_list = INT_CMget_contact_list(cm);
    }

    my_contact_str = attr_list_to_string(contact_list);
    free_attr_list(contact_list);
    
    msg.node_name = strdup(node_name);
    msg.contact_string = my_contact_str;
    msg.source_count = evp->source_count;
    msg.sources = malloc(msg.source_count * sizeof(msg.sources[0]));
    for (i=0; i < evp->source_count; i++) {
	msg.sources[i].name = strdup(evp->sources[i].name);
	msg.sources[i].FMtype = NULL;
    }
    msg.sink_count = evp->sink_handler_count;
    msg.sinks = malloc(msg.sink_count * sizeof(msg.sinks[0]));
    for (i=0; i < evp->sink_handler_count; i++) {
	msg.sinks[i].name = strdup(evp->sink_handlers[i].name);
	msg.sinks[i].FMtype = NULL;
    }
    INT_EVregister_close_handler(cm, dfg_stone_close_handler, (void*)client);
    
    if (master) {
	/* local master */
	queue_master_msg(master, (void*)&msg, DFGnode_join, NULL, /*copy*/0);
    } else {
	/*
	 * EVdfg client-sent messages
	 */
	register_msg = INT_CMregister_format(cm, EVdfg_node_join_format_list);
	INT_CMregister_format(cm, EVdfg_deploy_ack_format_list);
	INT_CMregister_format(cm, EVclient_shutdown_contribution_format_list);
	INT_CMregister_format(cm, EVdfg_conn_shutdown_format_list);
	INT_CMregister_format(cm, EVdfg_flush_attrs_reconfig_format_list);

	/*
	 * EVdfg client-handled messages
	 */
	INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_ready_format_list),
			       dfg_ready_handler, client);
	INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_deploy_format_list),
			       dfg_deploy_handler, client);
	INT_CMregister_handler(INT_CMregister_format(cm, EVclient_shutdown_format_list),
			       dfg_shutdown_handler, client);

	conn = INT_CMget_conn(cm, master_attrs);
	if (conn == NULL) {
	    fprintf(stderr, "failed to contact Master at %s\n", attr_list_to_string(master_attrs));
	    fprintf(stderr, "Join DFG failed\n");
	    return NULL;
	}
	INT_CMwrite(conn, register_msg, &msg);
	client->master_connection = conn;
	for (i=0; i < evp->source_count; i++) {
	    free(msg.sources[i].name);
	}
	free(msg.sources);
	for (i=0; i < evp->sink_handler_count; i++) {
	    free(msg.sinks[i].name);
	}
	free(msg.sinks);
	free(msg.contact_string);
	free(msg.node_name);
    }
    CMtrace_out(cm, EVdfgVerbose, "DFG %p node name %s\n", client, node_name);
    if (master_attrs) free_attr_list(master_attrs);
    INT_CMadd_shutdown_task(cm, free_client, client, FREE_TASK);
    return client;
}